

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

OneofDescriptor * __thiscall
google::protobuf::Descriptor::real_oneof_decl(Descriptor *this,int index)

{
  Nonnull<const_char_*> failure_msg;
  code *apcStack_20 [2];
  
  if (this->real_oneof_decl_count_ <= index) {
    apcStack_20[0] = (code *)0xb9e091;
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)(apcStack_20 + 1),
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xa8d,"index < real_oneof_decl_count()");
    apcStack_20[0] =
         compiler::java::MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>;
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)(apcStack_20 + 1));
  }
  failure_msg = absl::lts_20250127::log_internal::Check_LEImpl(0,index,"0 <= index");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::log_internal::Check_LTImpl
                            (index,this->oneof_decl_count_,"index < oneof_decl_count()");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      return this->oneof_decls_ + index;
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)apcStack_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xa89,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
            ((LogMessageFatal *)apcStack_20);
}

Assistant:

inline const OneofDescriptor* Descriptor::real_oneof_decl(int index) const {
  ABSL_DCHECK(index < real_oneof_decl_count());
  return oneof_decl(index);
}